

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moneystr.cpp
# Opt level: O2

string * FormatMoney_abi_cxx11_(string *__return_storage_ptr__,CAmount n)

{
  pointer pcVar1;
  int iVar2;
  size_type __n;
  long *in_R8;
  long in_FS_OFFSET;
  int64_t remainder;
  int64_t quotient;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  quotient = n / 100000000;
  remainder = n % 100000000;
  if (n < 0) {
    quotient = -quotient;
    remainder = -remainder;
  }
  tinyformat::format<long,long>
            (__return_storage_ptr__,(tinyformat *)0x22450a,(char *)&quotient,&remainder,in_R8);
  pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
  iVar2 = (int)__return_storage_ptr__->_M_string_length + -3;
  __n = 0;
  while ((pcVar1[iVar2 + 2] == '0' && ((byte)(pcVar1[iVar2] - 0x30U) < 10))) {
    iVar2 = iVar2 + -1;
    __n = __n + 1;
  }
  if ((int)__n != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              (__return_storage_ptr__,__return_storage_ptr__->_M_string_length - __n,__n);
  }
  if (n < 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
              (__return_storage_ptr__,0,1,'-');
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string FormatMoney(const CAmount n)
{
    // Note: not using straight sprintf here because we do NOT want
    // localized number formatting.
    static_assert(COIN > 1);
    int64_t quotient = n / COIN;
    int64_t remainder = n % COIN;
    if (n < 0) {
        quotient = -quotient;
        remainder = -remainder;
    }
    std::string str = strprintf("%d.%08d", quotient, remainder);

    // Right-trim excess zeros before the decimal point:
    int nTrim = 0;
    for (int i = str.size()-1; (str[i] == '0' && IsDigit(str[i-2])); --i)
        ++nTrim;
    if (nTrim)
        str.erase(str.size()-nTrim, nTrim);

    if (n < 0)
        str.insert(uint32_t{0}, 1, '-');
    return str;
}